

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_dump_image_comp_header
               (opj_image_comp_t *comp_header,OPJ_BOOL dev_dump_flag,FILE *out_stream)

{
  long lVar1;
  undefined8 in_RAX;
  char tab [3];
  undefined8 uStack_28;
  
  if (dev_dump_flag == 0) {
    uStack_28._0_5_ = (uint5)in_RAX;
    uStack_28 = (ulong)CONCAT25(0x909,(uint5)uStack_28);
  }
  else {
    uStack_28 = in_RAX;
    fwrite("[DEV] Dump an image_comp_header struct {\n",0x29,1,_stdout);
    uStack_28._0_6_ = (uint6)(uint5)uStack_28;
  }
  lVar1 = (long)&uStack_28 + 5;
  fprintf((FILE *)out_stream,"%s dx=%d, dy=%d\n",lVar1,(ulong)comp_header->dx,(ulong)comp_header->dy
         );
  fprintf((FILE *)out_stream,"%s prec=%d\n",lVar1,(ulong)comp_header->prec);
  fprintf((FILE *)out_stream,"%s sgnd=%d\n",lVar1,(ulong)comp_header->sgnd);
  if (dev_dump_flag != 0) {
    fwrite("}\n",2,1,(FILE *)out_stream);
  }
  return;
}

Assistant:

void j2k_dump_image_comp_header(opj_image_comp_t* comp_header,
                                OPJ_BOOL dev_dump_flag, FILE* out_stream)
{
    char tab[3];

    if (dev_dump_flag) {
        fprintf(stdout, "[DEV] Dump an image_comp_header struct {\n");
        tab[0] = '\0';
    }       else {
        tab[0] = '\t';
        tab[1] = '\t';
        tab[2] = '\0';
    }

    fprintf(out_stream, "%s dx=%d, dy=%d\n", tab, comp_header->dx, comp_header->dy);
    fprintf(out_stream, "%s prec=%d\n", tab, comp_header->prec);
    fprintf(out_stream, "%s sgnd=%d\n", tab, comp_header->sgnd);

    if (dev_dump_flag) {
        fprintf(out_stream, "}\n");
    }
}